

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O3

void __thiscall
density::
heter_queue<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_ostream>,_density::basic_default_allocator<65536UL>_>
::clean_dead_elements
          (heter_queue<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_ostream>,_density::basic_default_allocator<65536UL>_>
           *this)

{
  long lVar1;
  ulong uVar2;
  ControlBlock *i_page;
  long *in_FS_OFFSET;
  
  i_page = this->m_head;
  if (i_page != this->m_tail) {
    lVar1 = *in_FS_OFFSET;
    do {
      uVar2 = i_page->m_next;
      if (((uint)uVar2 & 3) != 2) break;
      if ((uVar2 & 4) != 0) {
        basic_default_allocator<65536UL>::deallocate
                  ((basic_default_allocator<65536UL> *)this,(void *)i_page[2].m_next,
                   i_page[3].m_next,i_page[4].m_next,0);
      }
      if (0xffff < (uVar2 ^ (ulong)i_page)) {
        detail::PageAllocator<density::detail::SystemPageManager<65536ul>>::t_instance::__tls_init()
        ;
        detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::
        deallocate_page<(density::detail::page_allocation_type)0>
                  ((PageAllocator<density::detail::SystemPageManager<65536UL>_> *)(lVar1 + -0xc0),
                   i_page);
      }
      i_page = (ControlBlock *)(uVar2 & 0xfffffffffffffff8);
    } while (this->m_tail != i_page);
  }
  this->m_head = i_page;
  return;
}

Assistant:

void clean_dead_elements() noexcept
        {
            auto curr = m_head;
            while (curr != m_tail)
            {
                // break if the current block is busy or is not dead
                if (
                  (curr->m_next & (detail::Queue_Busy | detail::Queue_Dead)) != detail::Queue_Dead)
                {
                    break;
                }

                auto next =
                  reinterpret_cast<ControlBlock *>(curr->m_next & ~detail::Queue_AllFlags);
                if (curr->m_next & detail::Queue_External)
                {
                    auto result = address_add(curr, s_sizeof_ControlBlock + s_sizeof_RuntimeType);
                    const auto & block = *static_cast<ExternalBlock *>(result);
                    ALLOCATOR_TYPE::deallocate(block.m_element, block.m_size, block.m_alignment);
                }

                if (!same_page(next, curr))
                {
                    allocator_type::deallocate_page(curr);
                }

                curr = next;
            }

            DENSITY_ASSERT_INTERNAL(
              curr == m_tail ||
              (curr->m_next & (detail::Queue_Busy | detail::Queue_Dead)) != detail::Queue_Dead);
            m_head = curr;
        }